

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Exporter::ExportScene(glTF2Exporter *this)

{
  element_type *peVar1;
  Ref<glTF2::Scene> RVar2;
  Ref<glTF2::Node> local_28;
  
  RVar2 = glTF2::LazyDict<glTF2::Scene>::Create
                    (&((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->scenes,"defaultScene");
  peVar1 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((int)((ulong)((long)*(pointer *)
                           ((long)&(peVar1->nodes).mObjs.
                                   super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>
                                   ._M_impl.super__Vector_impl_data + 8) -
                   (long)(peVar1->nodes).mObjs.
                         super__Vector_base<glTF2::Node_*,_std::allocator<glTF2::Node_*>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3) != 0) {
    local_28.vector = &(peVar1->nodes).mObjs;
    local_28.index = 0;
    std::vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>>::
    emplace_back<glTF2::Ref<glTF2::Node>>
              ((vector<glTF2::Ref<glTF2::Node>,std::allocator<glTF2::Ref<glTF2::Node>>> *)
               &((RVar2.vector)->super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>
                )._M_impl.super__Vector_impl_data._M_start[RVar2.index]->nodes,&local_28);
    peVar1 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (peVar1->scene).vector = RVar2.vector;
  (peVar1->scene).index = RVar2.index;
  return;
}

Assistant:

void glTF2Exporter::ExportScene()
{
    const char* sceneName = "defaultScene";
    Ref<Scene> scene = mAsset->scenes.Create(sceneName);

    // root node will be the first one exported (idx 0)
    if (mAsset->nodes.Size() > 0) {
        scene->nodes.push_back(mAsset->nodes.Get(0u));
    }

    // set as the default scene
    mAsset->scene = scene;
}